

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

ListNode * list_get_(List *list,uint index)

{
  ListNode *pLVar1;
  bool bVar2;
  
  if (index < list->size) {
    while (pLVar1 = list->head, pLVar1 != (ListNode *)0x0) {
      bVar2 = index == 0;
      index = index - 1;
      if (bVar2) {
        return pLVar1;
      }
      list = (List *)&pLVar1->next;
    }
  }
  return (ListNode *)0x0;
}

Assistant:

ListNode* list_get_(List * list, unsigned int index){
    if (index >= list->size || index < 0){
        return NULL;
    }
    int tmp = 0;
    ListNode *curNode = list->head;
    while (curNode != NULL){
        if (tmp == index){
            return curNode;
        }
        tmp++;
        curNode = curNode->next;
    }
    return NULL;
}